

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,avector<AffineSpace3ff> *spaces,Ref<embree::SceneGraph::Node> *child)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  Node *pNVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar12;
  long lVar13;
  size_t i;
  ulong uVar14;
  
  Node::Node(&this->super_Node,false);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__TransformNode_002a45d8;
  (this->spaces).time_range.lower = 0.0;
  (this->spaces).time_range.upper = 1.0;
  (this->spaces).spaces.size_active = spaces->size_active;
  sVar5 = spaces->size_alloced;
  (this->spaces).spaces.size_alloced = sVar5;
  pAVar12 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar5 << 6,0x10);
  (this->spaces).spaces.items = pAVar12;
  lVar13 = 0x30;
  for (uVar14 = 0; uVar14 < (this->spaces).spaces.size_active; uVar14 = uVar14 + 1) {
    pAVar12 = (this->spaces).spaces.items;
    pAVar6 = spaces->items;
    puVar3 = (undefined8 *)((long)pAVar6 + lVar13 + -0x30);
    uVar11 = puVar3[1];
    puVar4 = (undefined8 *)((long)pAVar12 + lVar13 + -0x30);
    *puVar4 = *puVar3;
    puVar4[1] = uVar11;
    puVar3 = (undefined8 *)((long)pAVar6 + lVar13 + -0x20);
    uVar11 = puVar3[1];
    puVar4 = (undefined8 *)((long)pAVar12 + lVar13 + -0x20);
    *puVar4 = *puVar3;
    puVar4[1] = uVar11;
    puVar3 = (undefined8 *)((long)pAVar6 + lVar13 + -0x10);
    uVar11 = puVar3[1];
    puVar4 = (undefined8 *)((long)pAVar12 + lVar13 + -0x10);
    *puVar4 = *puVar3;
    puVar4[1] = uVar11;
    puVar1 = (undefined4 *)((long)&(pAVar6->l).vx.field_0 + lVar13);
    uVar8 = puVar1[1];
    uVar9 = puVar1[2];
    uVar10 = puVar1[3];
    puVar2 = (undefined4 *)((long)&(pAVar12->l).vx.field_0 + lVar13);
    *puVar2 = *puVar1;
    puVar2[1] = uVar8;
    puVar2[2] = uVar9;
    puVar2[3] = uVar10;
    lVar13 = lVar13 + 0x40;
  }
  (this->spaces).quaternion = false;
  pNVar7 = child->ptr;
  (this->child).ptr = pNVar7;
  if (pNVar7 != (Node *)0x0) {
    (*(pNVar7->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

TransformNode (const avector<AffineSpace3ff>& spaces, const Ref<Node>& child)
        : spaces(spaces), child(child) {}